

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<unsigned_char> * __thiscall
asl::Array<unsigned_char>::reserve(Array<unsigned_char> *this,int m)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined8 *puVar5;
  uchar *__src;
  uint uVar6;
  
  __src = this->_a;
  uVar1 = *(uint *)(__src + -0xc);
  if ((int)uVar1 < m) {
    uVar6 = uVar1 * 2;
    if ((int)(uVar1 * 2) <= m) {
      uVar6 = m;
    }
    iVar2 = *(int *)(__src + -0x10);
    if (uVar1 < 0x800) {
      piVar4 = (int *)malloc((ulong)(uVar6 + 0x10));
      if (piVar4 == (int *)0x0) {
LAB_0011e750:
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = dup2;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if (iVar2 <= m) {
        m = iVar2;
      }
      memcpy(piVar4 + 4,__src,(long)m);
      if (uVar6 == uVar1) {
        return this;
      }
      dup(this,(int)__src);
      iVar3 = *(int *)(this->_a + -8);
      free(this->_a + -0x10);
      this->_a = (uchar *)(piVar4 + 4);
    }
    else {
      dup(this,m);
      iVar3 = *(int *)(this->_a + -8);
      piVar4 = (int *)realloc(this->_a + -0x10,(long)(int)uVar6 + 0x10);
      if (piVar4 == (int *)0x0) goto LAB_0011e750;
      this->_a = (uchar *)(piVar4 + 4);
    }
    piVar4[2] = iVar3;
    piVar4[1] = uVar6;
    *piVar4 = iVar2;
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}